

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConcaveCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btConvexTriangleCallback::setTimeStepAndCounters
          (btConvexTriangleCallback *this,btScalar collisionMarginTriangle,
          btDispatcherInfo *dispatchInfo,btCollisionObjectWrapper *convexBodyWrap,
          btCollisionObjectWrapper *triBodyWrap,btManifoldResult *resultOut)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  btTransform *in_RDI;
  undefined8 in_R8;
  btScalar in_XMM0_Da;
  btVector3 extra;
  btScalar extraMargin;
  btCollisionShape *convexShape;
  btTransform convexInTriangleSpace;
  btTransform *in_stack_fffffffffffffef0;
  btScalar local_fc;
  btCollisionShape *local_f8;
  btTransform *in_stack_ffffffffffffff40;
  btTransform *in_stack_ffffffffffffff48;
  btTransform *in_stack_ffffffffffffff58;
  undefined1 local_70 [100];
  btScalar local_c;
  
  *(undefined8 *)((in_RDI->m_basis).m_el[0].m_floats + 2) = in_RDX;
  *(undefined8 *)(in_RDI->m_basis).m_el[1].m_floats = in_RCX;
  *(undefined8 *)(in_RDI[1].m_basis.m_el[0].m_floats + 2) = in_RSI;
  in_RDI[1].m_basis.m_el[1].m_floats[0] = in_XMM0_Da;
  *(undefined8 *)((in_RDI->m_origin).m_floats + 2) = in_R8;
  local_c = in_XMM0_Da;
  btTransform::btTransform(in_stack_fffffffffffffef0);
  btCollisionObjectWrapper::getWorldTransform
            (*(btCollisionObjectWrapper **)(in_RDI->m_basis).m_el[1].m_floats);
  btTransform::inverse(in_stack_ffffffffffffff58);
  btCollisionObjectWrapper::getWorldTransform
            (*(btCollisionObjectWrapper **)((in_RDI->m_basis).m_el[0].m_floats + 2));
  btTransform::operator*(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  btTransform::operator=(in_stack_fffffffffffffef0,in_RDI);
  local_f8 = btCollisionObjectWrapper::getCollisionShape
                       (*(btCollisionObjectWrapper **)((in_RDI->m_basis).m_el[0].m_floats + 2));
  (*local_f8->_vptr_btCollisionShape[2])
            (local_f8,local_70,(in_RDI->m_basis).m_el[1].m_floats + 2,
             (in_RDI->m_basis).m_el[2].m_floats + 2);
  local_fc = local_c;
  btVector3::btVector3((btVector3 *)&stack0xfffffffffffffef4,&local_fc,&local_fc,&local_fc);
  btVector3::operator+=
            ((btVector3 *)((in_RDI->m_basis).m_el[2].m_floats + 2),
             (btVector3 *)&stack0xfffffffffffffef4);
  btVector3::operator-=
            ((btVector3 *)((in_RDI->m_basis).m_el[1].m_floats + 2),
             (btVector3 *)&stack0xfffffffffffffef4);
  return;
}

Assistant:

void	btConvexTriangleCallback::setTimeStepAndCounters(btScalar collisionMarginTriangle,const btDispatcherInfo& dispatchInfo,const btCollisionObjectWrapper* convexBodyWrap, const btCollisionObjectWrapper* triBodyWrap, btManifoldResult* resultOut)
{
	m_convexBodyWrap = convexBodyWrap;
	m_triBodyWrap = triBodyWrap;

	m_dispatchInfoPtr = &dispatchInfo;
	m_collisionMarginTriangle = collisionMarginTriangle;
	m_resultOut = resultOut;

	//recalc aabbs
	btTransform convexInTriangleSpace;
	convexInTriangleSpace = m_triBodyWrap->getWorldTransform().inverse() * m_convexBodyWrap->getWorldTransform();
	const btCollisionShape* convexShape = static_cast<const btCollisionShape*>(m_convexBodyWrap->getCollisionShape());
	//CollisionShape* triangleShape = static_cast<btCollisionShape*>(triBody->m_collisionShape);
	convexShape->getAabb(convexInTriangleSpace,m_aabbMin,m_aabbMax);
	btScalar extraMargin = collisionMarginTriangle;
	btVector3 extra(extraMargin,extraMargin,extraMargin);

	m_aabbMax += extra;
	m_aabbMin -= extra;
	
}